

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_interface.h
# Opt level: O2

void __thiscall
yyml::nn::OptimizerInterface::Apply(OptimizerInterface *this,function<double_()> *init_func)

{
  pointer ppVVar1;
  Variable<double> *pVVar2;
  size_t i;
  ulong uVar3;
  pointer ppVVar4;
  double dVar5;
  
  ppVVar1 = (this->parameters_).
            super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar4 = (this->parameters_).
                 super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVVar4 != ppVVar1;
      ppVVar4 = ppVVar4 + 1) {
    pVVar2 = *ppVVar4;
    for (uVar3 = 0; uVar3 < (pVVar2->grads_).shape_.total; uVar3 = uVar3 + 1) {
      dVar5 = std::function<double_()>::operator()(init_func);
      (pVVar2->values_).data_[uVar3] = dVar5;
    }
  }
  return;
}

Assistant:

void Apply(std::function<double()> init_func) {
    for (auto* parameter : parameters_) {
      for (size_t i = 0; i < parameter->grads_.total(); i++) {
        parameter->values_.data_[i] = init_func();
      }
    }
  }